

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPIRVShaderResources.cpp
# Opt level: O1

SHADER_RESOURCE_TYPE Diligent::SPIRVShaderResourceAttribs::GetShaderResourceType(ResourceType Type)

{
  SHADER_RESOURCE_TYPE SVar1;
  undefined7 in_register_00000039;
  string _msg;
  string local_28;
  
  switch(CONCAT71(in_register_00000039,Type) & 0xffffffff) {
  case 0:
    SVar1 = SHADER_RESOURCE_TYPE_CONSTANT_BUFFER;
    break;
  case 1:
  case 3:
    SVar1 = SHADER_RESOURCE_TYPE_BUFFER_SRV;
    break;
  case 5:
    SVar1 = SHADER_RESOURCE_TYPE_TEXTURE_UAV;
    break;
  case 6:
  case 8:
    SVar1 = SHADER_RESOURCE_TYPE_TEXTURE_SRV;
    break;
  case 7:
    FormatString<char[64]>
              (&local_28,
               (char (*) [64])"There is no appropriate shader resource type for atomic counter");
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,local_28._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
  case 2:
  case 4:
    SVar1 = SHADER_RESOURCE_TYPE_BUFFER_UAV;
    break;
  case 9:
    SVar1 = SHADER_RESOURCE_TYPE_SAMPLER;
    break;
  case 10:
    SVar1 = SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT;
    break;
  case 0xb:
    SVar1 = SHADER_RESOURCE_TYPE_ACCEL_STRUCT;
    break;
  default:
    FormatString<char[28]>(&local_28,(char (*) [28])"Unknown SPIRV resource type");
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetShaderResourceType",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/SPIRVShaderResources.cpp"
               ,0xae);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    SVar1 = SHADER_RESOURCE_TYPE_UNKNOWN;
  }
  return SVar1;
}

Assistant:

SHADER_RESOURCE_TYPE SPIRVShaderResourceAttribs::GetShaderResourceType(ResourceType Type)
{
    static_assert(Uint32{SPIRVShaderResourceAttribs::ResourceType::NumResourceTypes} == 12, "Please handle the new resource type below");
    switch (Type)
    {
        case SPIRVShaderResourceAttribs::ResourceType::UniformBuffer:
            return SHADER_RESOURCE_TYPE_CONSTANT_BUFFER;

        case SPIRVShaderResourceAttribs::ResourceType::ROStorageBuffer:
            // Read-only storage buffers map to buffer SRV
            // https://github.com/KhronosGroup/SPIRV-Cross/wiki/Reflection-API-user-guide#read-write-vs-read-only-resources-for-hlsl
            return SHADER_RESOURCE_TYPE_BUFFER_SRV;

        case SPIRVShaderResourceAttribs::ResourceType::RWStorageBuffer:
            return SHADER_RESOURCE_TYPE_BUFFER_UAV;

        case SPIRVShaderResourceAttribs::ResourceType::UniformTexelBuffer:
            return SHADER_RESOURCE_TYPE_BUFFER_SRV;

        case SPIRVShaderResourceAttribs::ResourceType::StorageTexelBuffer:
            return SHADER_RESOURCE_TYPE_BUFFER_UAV;

        case SPIRVShaderResourceAttribs::ResourceType::StorageImage:
            return SHADER_RESOURCE_TYPE_TEXTURE_UAV;

        case SPIRVShaderResourceAttribs::ResourceType::SampledImage:
            return SHADER_RESOURCE_TYPE_TEXTURE_SRV;

        case SPIRVShaderResourceAttribs::ResourceType::AtomicCounter:
            LOG_WARNING_MESSAGE("There is no appropriate shader resource type for atomic counter");
            return SHADER_RESOURCE_TYPE_BUFFER_UAV;

        case SPIRVShaderResourceAttribs::ResourceType::SeparateImage:
            return SHADER_RESOURCE_TYPE_TEXTURE_SRV;

        case SPIRVShaderResourceAttribs::ResourceType::SeparateSampler:
            return SHADER_RESOURCE_TYPE_SAMPLER;

        case SPIRVShaderResourceAttribs::ResourceType::InputAttachment:
            return SHADER_RESOURCE_TYPE_INPUT_ATTACHMENT;

        case SPIRVShaderResourceAttribs::ResourceType::AccelerationStructure:
            return SHADER_RESOURCE_TYPE_ACCEL_STRUCT;

        default:
            UNEXPECTED("Unknown SPIRV resource type");
            return SHADER_RESOURCE_TYPE_UNKNOWN;
    }
}